

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O1

snd_config_t * init_local_config_with_workaround(char *pcm_name)

{
  int iVar1;
  uint uVar2;
  snd_config_t *psVar3;
  snd_config_t *psVar4;
  snd_config_t *pcm_node;
  snd_config_t *lconf;
  snd_config_t *node;
  snd_config_t *slave_def;
  char *string;
  snd_config_t *slave_pcm;
  char *string_1;
  snd_config_t *pcm;
  char node_name [64];
  char node_name_1 [64];
  snd_config_t *local_f8;
  snd_config_t *local_f0;
  snd_config_t *local_e8;
  snd_config_t *local_e0;
  char *local_d8;
  snd_config_t *local_d0;
  char *local_c8;
  snd_config_t *local_c0;
  char local_b8 [64];
  char local_78 [72];
  
  local_f0 = (snd_config_t *)0x0;
  if ((*cubeb_snd_config != (snd_config_t *)0x0) &&
     (iVar1 = (*cubeb_snd_config_copy)(&local_f0,*cubeb_snd_config), -1 < iVar1)) {
    iVar1 = (*cubeb_snd_config_search_definition)(local_f0,"pcm","default",&local_f8);
    if ((-1 < iVar1) &&
       (((iVar1 = (*cubeb_snd_config_get_id)(local_f8,&local_d8), -1 < iVar1 &&
         (uVar2 = snprintf(local_b8,0x40,"pcm.%s",local_d8), uVar2 < 0x41)) &&
        (iVar1 = (*cubeb_snd_config_search)(local_f0,local_b8,&local_f8), -1 < iVar1)))) {
      psVar3 = local_f8;
      do {
        local_f8 = psVar3;
        psVar3 = local_f0;
        local_e0 = (snd_config_t *)0x0;
        iVar1 = (*cubeb_snd_config_search)(local_f8,"slave",&local_d0);
        if ((iVar1 < 0) ||
           ((iVar1 = (*cubeb_snd_config_get_string)(local_d0,&local_c8), -1 < iVar1 &&
            (iVar1 = (*cubeb_snd_config_search_definition)(psVar3,"pcm_slave",local_c8,&local_e0),
            iVar1 < 0)))) {
LAB_0010fab7:
          psVar3 = (snd_config_t *)0x0;
        }
        else {
          psVar4 = local_e0;
          if (local_e0 == (snd_config_t *)0x0) {
            psVar4 = local_d0;
          }
          iVar1 = (*cubeb_snd_config_search)(psVar4,"pcm",&local_c0);
          if (iVar1 < 0) {
LAB_0010faa7:
            if (local_e0 != (snd_config_t *)0x0) {
              (*cubeb_snd_config_delete)(local_e0);
            }
            goto LAB_0010fab7;
          }
          psVar4 = local_e0;
          if (local_e0 == (snd_config_t *)0x0) {
            psVar4 = local_d0;
          }
          iVar1 = (*cubeb_snd_config_get_string)(psVar4,&local_c8);
          if (((iVar1 < 0) || (uVar2 = snprintf(local_78,0x40,"pcm.%s",local_c8), 0x40 < uVar2)) ||
             (iVar1 = (*cubeb_snd_config_search)(psVar3,local_78,&local_c0), psVar3 = local_c0,
             iVar1 < 0)) goto LAB_0010faa7;
        }
        local_e8 = psVar3;
      } while (psVar3 != (snd_config_t *)0x0);
      iVar1 = (*cubeb_snd_config_search)(local_f8,"type",&local_e8);
      if (((((-1 < iVar1) &&
            (iVar1 = (*cubeb_snd_config_get_string)(local_e8,&local_d8), -1 < iVar1)) &&
           (iVar1 = strcmp(local_d8,"pulse"), iVar1 == 0)) &&
          ((iVar1 = (*cubeb_snd_config_search)(local_f8,"handle_underrun",&local_e8), iVar1 == -2 &&
           (iVar1 = (*cubeb_snd_config_imake_integer)(&local_e8,"handle_underrun",0), -1 < iVar1))))
         && (iVar1 = (*cubeb_snd_config_add)(local_f8,local_e8), -1 < iVar1)) {
        return local_f0;
      }
    }
    (*cubeb_snd_config_delete)(local_f0);
  }
  return (snd_config_t *)0x0;
}

Assistant:

static snd_config_t *
init_local_config_with_workaround(char const * pcm_name)
{
  int r;
  snd_config_t * lconf;
  snd_config_t * pcm_node;
  snd_config_t * node;
  char const * string;
  char node_name[64];

  lconf = NULL;

  if (WRAP(snd_config) == NULL) {
    return NULL;
  }

  r = WRAP(snd_config_copy)(&lconf, WRAP(snd_config));
  if (r < 0) {
    return NULL;
  }

  do {
    r = WRAP(snd_config_search_definition)(lconf, "pcm", pcm_name, &pcm_node);
    if (r < 0) {
      break;
    }

    r = WRAP(snd_config_get_id)(pcm_node, &string);
    if (r < 0) {
      break;
    }

    r = snprintf(node_name, sizeof(node_name), "pcm.%s", string);
    if (r < 0 || r > (int)sizeof(node_name)) {
      break;
    }
    r = WRAP(snd_config_search)(lconf, node_name, &pcm_node);
    if (r < 0) {
      break;
    }

    /* If this PCM has a slave, walk the slave configurations until we reach the
     * bottom. */
    while ((node = get_slave_pcm_node(lconf, pcm_node)) != NULL) {
      pcm_node = node;
    }

    /* Fetch the PCM node's type, and bail out if it's not the PulseAudio
     * plugin. */
    r = WRAP(snd_config_search)(pcm_node, "type", &node);
    if (r < 0) {
      break;
    }

    r = WRAP(snd_config_get_string)(node, &string);
    if (r < 0) {
      break;
    }

    if (strcmp(string, "pulse") != 0) {
      break;
    }

    /* Don't clobber an explicit existing handle_underrun value, set it only
       if it doesn't already exist. */
    r = WRAP(snd_config_search)(pcm_node, "handle_underrun", &node);
    if (r != -ENOENT) {
      break;
    }

    /* Disable pcm_pulse's asynchronous underrun handling. */
    r = WRAP(snd_config_imake_integer)(&node, "handle_underrun", 0);
    if (r < 0) {
      break;
    }

    r = WRAP(snd_config_add)(pcm_node, node);
    if (r < 0) {
      break;
    }

    return lconf;
  } while (0);

  WRAP(snd_config_delete)(lconf);

  return NULL;
}